

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O0

void __thiscall QByteArrayView::QByteArrayView<11ul>(QByteArrayView *this,char (*data) [11])

{
  QByteArrayView *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  QByteArrayView *this_00;
  
  this_00 = in_RSI;
  lengthHelperCharArray(unaff_retaddr,in_RDI);
  QByteArrayView<char,_true>(this_00,(char *)in_RSI,in_RDI);
  return;
}

Assistant:

constexpr QByteArrayView(const char (&data)[Size]) noexcept
        : QByteArrayView(data, lengthHelperCharArray(data, Size)) {}